

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinePositionSpan.cpp
# Opt level: O1

bool psy::operator==(LinePositionSpan *a,LinePositionSpan *b)

{
  bool bVar1;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  local_18 = *(undefined8 *)a;
  local_20 = *(undefined8 *)b;
  bVar1 = operator==((LinePosition *)&local_18,(LinePosition *)&local_20);
  if (bVar1) {
    local_28 = *(undefined8 *)(a + 8);
    local_30 = *(undefined8 *)(b + 8);
    bVar1 = operator==((LinePosition *)&local_28,(LinePosition *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const LinePositionSpan& a, const LinePositionSpan& b)
{
    return a.start() == b.start() && a.end() == b.end();
}